

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
::streamReconstructedExpression
          (BinaryExpr<const_FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *value;
  string *in_R9;
  StringRef op;
  type local_60;
  type local_40;
  
  StringMaker<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>,void>::
  convert<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>>
            (&local_40,
             (StringMaker<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>,void>
              *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>,void>::
  convert<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>>
            (&local_60,
             (StringMaker<FlatMap<std::__cxx11::string,float,std::less<std::__cxx11::string>>,void>
              *)this->m_rhs,value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }